

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_scan_root_p_tree_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  int iVar1;
  bsc_step_t bVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  if (group == (bsc_group_t)0x0) {
    iVar1 = bsp_nprocs();
  }
  else {
    iVar1 = *group;
  }
  dVar5 = (double)iVar1;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar5 = ceil(dVar5);
  uVar3 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar3;
  }
  bVar2 = depends;
  for (; uVar4 * 0x30 - uVar3 != 0; uVar3 = uVar3 + 0x30) {
    bVar2 = bsc_scan_qtree_single
                      (depends,group,*(void **)((long)&params->src + uVar3),
                       *(void **)((long)&params->dst + uVar3),*(void **)((long)&params->tmp + uVar3)
                       ,*(bsc_reduce_t *)((long)&params->reducer + uVar3),
                       *(void **)((long)&params->zero + uVar3),
                       *(bsc_size_t *)((long)&params->nmemb + uVar3),
                       *(bsc_size_t *)((long)&params->size + uVar3),(int)dVar5);
  }
  return bVar2;
}

Assistant:

bsc_step_t bsc_scan_root_p_tree_multiple( bsc_step_t depends,
                      bsc_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs(), root_P = (bsc_pid_t) ceil(sqrt(P));
    bsc_size_t i;
    bsc_step_t finished = depends;
    (void) root;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_scan_qtree_single( depends, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, root_P );
    }

    return finished;
}